

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O0

void rainbowCycle(int SpeedDelay)

{
  byte *pbVar1;
  ushort local_1c;
  ushort local_1a;
  uint16_t j;
  uint16_t i;
  byte *c;
  int SpeedDelay_local;
  
  for (local_1c = 0; local_1c < 0x500; local_1c = local_1c + 1) {
    for (local_1a = 0; local_1a < 0x18; local_1a = local_1a + 1) {
      pbVar1 = Wheel((char)(((uint)local_1a << 8) / 0x18) + (char)local_1c);
      setPixel((uint)local_1a,*pbVar1,pbVar1[1],pbVar1[2]);
    }
    showStrip();
    delay(SpeedDelay);
  }
  return;
}

Assistant:

void rainbowCycle(int SpeedDelay) {
    byte *c;
    uint16_t i, j;

    for(j=0; j<256*5; j++) { // 5 cycles of all colors on wheel
        for(i=0; i< NUM_LEDS; i++) {
            c=Wheel(((i * 256 / NUM_LEDS) + j) & 255);
            setPixel(i, *c, *(c+1), *(c+2));
        }
        showStrip();
        delay(SpeedDelay);
    }
}